

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O1

bool DoGiveInventory(AActor *receiver,bool orresult,VMValue *param,
                    TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,int numret)

{
  byte *pbVar1;
  PClassActor *type;
  _func_int **pp_Var2;
  PClass *pPVar3;
  int iVar4;
  int iVar5;
  VMValue *pVVar6;
  undefined4 extraout_var;
  AInventory *this;
  undefined4 extraout_var_00;
  PClass *pPVar7;
  PClassActor *pPVar8;
  char *pcVar9;
  bool bVar10;
  DVector3 local_48;
  
  if (numparam < 2) {
    pcVar9 = "(paramnum) < numparam";
  }
  else {
    if ((param[1].field_0.field_3.Type == '\x03') &&
       ((param[1].field_0.field_1.atag == 1 || (param[1].field_0.field_1.a == (void *)0x0)))) {
      type = (PClassActor *)param[1].field_0.field_1.a;
      if ((type != (PClassActor *)0x0) &&
         (pPVar8 = type, type != (PClassActor *)AInventory::RegistrationInfo.MyClass)) {
        do {
          pPVar8 = (PClassActor *)(pPVar8->super_PClass).ParentClass;
          if (pPVar8 == (PClassActor *)AInventory::RegistrationInfo.MyClass) break;
        } while (pPVar8 != (PClassActor *)0x0);
        if (pPVar8 == (PClassActor *)0x0) {
          pcVar9 = "mi == NULL || mi->IsDescendantOf(RUNTIME_CLASS(AInventory))";
          goto LAB_003cf168;
        }
      }
      if (numparam == 2) {
        pVVar6 = defaultparam->Array;
        if (defaultparam->Array[2].field_0.field_3.Type != '\0') {
          pcVar9 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_003cf149:
          __assert_fail(pcVar9,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                        ,0x945,
                        "bool DoGiveInventory(AActor *, bool, VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
      }
      else {
        pVVar6 = param;
        if (param[2].field_0.field_3.Type != '\0') {
          pcVar9 = "(param[paramnum]).Type == REGT_INT";
          goto LAB_003cf149;
        }
      }
      iVar5 = pVVar6[2].field_0.i;
      if (!orresult) {
        if (numparam < 4) {
          param = defaultparam->Array;
          if (param[3].field_0.field_3.Type != '\0') {
            pcVar9 = "(defaultparam[paramnum]).Type == REGT_INT";
            goto LAB_003cf187;
          }
        }
        else if (param[3].field_0.field_3.Type != '\0') {
          pcVar9 = "(param[paramnum]).Type == REGT_INT";
LAB_003cf187:
          __assert_fail(pcVar9,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                        ,0x949,
                        "bool DoGiveInventory(AActor *, bool, VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
        receiver = COPY_AAPTR(receiver,param[3].field_0.i);
      }
      pPVar3 = AInventory::RegistrationInfo.MyClass;
      if (receiver != (AActor *)0x0) {
        if ((receiver->super_DThinker).super_DObject.Class == (PClass *)0x0) {
          iVar4 = (**(receiver->super_DThinker).super_DObject._vptr_DObject)(receiver);
          (receiver->super_DThinker).super_DObject.Class = (PClass *)CONCAT44(extraout_var,iVar4);
        }
        pPVar7 = (receiver->super_DThinker).super_DObject.Class;
        bVar10 = pPVar7 != (PClass *)0x0;
        if (pPVar7 != pPVar3 && bVar10) {
          do {
            pPVar7 = pPVar7->ParentClass;
            bVar10 = pPVar7 != (PClass *)0x0;
            if (pPVar7 == pPVar3) break;
          } while (pPVar7 != (PClass *)0x0);
        }
        if ((bVar10) &&
           (pp_Var2 = receiver[1].super_DThinker.super_DObject._vptr_DObject,
           pp_Var2 != (_func_int **)0x0)) {
          if (((ulong)pp_Var2[4] & 0x20) == 0) {
            return false;
          }
          receiver[1].super_DThinker.super_DObject._vptr_DObject = (_func_int **)0x0;
        }
        iVar4 = 1;
        if (1 < iVar5) {
          iVar4 = iVar5;
        }
        if (type != (PClassActor *)0x0) {
          local_48.X = 0.0;
          local_48.Y = 0.0;
          local_48.Z = 0.0;
          this = (AInventory *)AActor::StaticSpawn(type,&local_48,NO_REPLACE,false);
          pPVar3 = AHealth::RegistrationInfo.MyClass;
          if (this == (AInventory *)0x0) {
            return false;
          }
          if ((this->super_AActor).super_DThinker.super_DObject.Class == (PClass *)0x0) {
            iVar5 = (**(this->super_AActor).super_DThinker.super_DObject._vptr_DObject)(this);
            (this->super_AActor).super_DThinker.super_DObject.Class =
                 (PClass *)CONCAT44(extraout_var_00,iVar5);
          }
          pPVar7 = (this->super_AActor).super_DThinker.super_DObject.Class;
          bVar10 = pPVar7 != (PClass *)0x0;
          if (pPVar7 != pPVar3 && bVar10) {
            do {
              pPVar7 = pPVar7->ParentClass;
              bVar10 = pPVar7 != (PClass *)0x0;
              if (pPVar7 == pPVar3) break;
            } while (pPVar7 != (PClass *)0x0);
          }
          if (bVar10) {
            iVar4 = iVar4 * this->Amount;
          }
          this->Amount = iVar4;
          pbVar1 = (byte *)((long)&(this->super_AActor).flags.Value + 2);
          *pbVar1 = *pbVar1 | 2;
          AActor::ClearCounters((AActor *)this);
          bVar10 = AInventory::CallTryPickup(this,receiver,(AActor **)0x0);
          if (bVar10) {
            return true;
          }
          (*(this->super_AActor).super_DThinker.super_DObject._vptr_DObject[4])(this);
        }
      }
      return false;
    }
    pcVar9 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
  }
LAB_003cf168:
  __assert_fail(pcVar9,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                ,0x944,
                "bool DoGiveInventory(AActor *, bool, VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
               );
}

Assistant:

static bool DoGiveInventory(AActor *receiver, bool orresult, VM_ARGS)
{
	int paramnum = 0;
	PARAM_CLASS		(mi, AInventory);
	PARAM_INT_DEF	(amount)

	if (!orresult)
	{
		PARAM_INT_DEF(setreceiver)
		receiver = COPY_AAPTR(receiver, setreceiver);
	}
	if (receiver == NULL)
	{ // If there's nothing to receive it, it's obviously a fail, right?
		return false;
	}
	// Owned inventory items cannot own anything because their Inventory pointer is repurposed for the owner's linked list.
	if (receiver->IsKindOf(RUNTIME_CLASS(AInventory)) && static_cast<AInventory*>(receiver)->Owner != nullptr)
	{
		return false;
	}

	if (amount <= 0)
	{
		amount = 1;
	}
	if (mi) 
	{
		AInventory *item = static_cast<AInventory *>(Spawn(mi));
		if (item == NULL)
		{
			return false;
		}
		if (item->IsKindOf(RUNTIME_CLASS(AHealth)))
		{
			item->Amount *= amount;
		}
		else
		{
			item->Amount = amount;
		}
		item->flags |= MF_DROPPED;
		item->ClearCounters();
		if (!item->CallTryPickup(receiver))
		{
			item->Destroy();
			return false;
		}
		else
		{
			return true;
		}
	}
	return false;
}